

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

int libssh2_channel_handle_extended_data2(LIBSSH2_CHANNEL *channel,int mode)

{
  int iVar1;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar1 = -0x27;
  }
  else {
    iVar1 = 0;
    time((time_t *)0x0);
    if (channel->extData2_state == libssh2_NB_state_idle) {
      (channel->remote).extended_data_ignore_mode = (char)mode;
    }
    channel->extData2_state = libssh2_NB_state_idle;
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_channel_handle_extended_data2(LIBSSH2_CHANNEL *channel,
                                      int mode)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session, _libssh2_channel_extended_data(channel,
                                                                      mode));
    return rc;
}